

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.cpp
# Opt level: O2

int __thiscall cg_other::operator()(cg_other *this,point p)

{
  pointer pcVar1;
  uint uVar2;
  ulong uVar3;
  
  pcVar1 = (this->data).super__Vector_base<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar2 = 0;
  do {
    uVar3 = (ulong)uVar2;
    if ((ulong)(((long)(this->data).
                       super__Vector_base<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pcVar1) / 0xc) <= uVar3) {
      return -1;
    }
    uVar2 = uVar2 + 1;
  } while (pcVar1[uVar3].p != p);
  return pcVar1[uVar3].ch;
}

Assistant:

int cg_other::operator()(point p) {
    for (unsigned i = 0; i < data.size(); i++) {
        if (data[i].p == p) return data[i].ch;
    }
    return -1;
}